

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int ReconstructIntra16(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  uint8_t *puVar2;
  VP8Encoder *enc;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  int16_t *piVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint16_t *puVar11;
  int16_t (*paiVar12) [16];
  long lVar13;
  long lVar14;
  long lVar15;
  int16_t dc_tmp [16];
  int16_t tmp [16] [16];
  int16_t local_258 [16];
  int16_t local_238 [260];
  
  puVar2 = it->yuv_in_;
  enc = it->enc_;
  uVar1 = VP8I16ModeOffsets[mode];
  puVar3 = it->yuv_p_;
  uVar4 = *(byte *)it->mb_ >> 5 & 3;
  uVar9 = 0xfffffffffffffffe;
  piVar6 = local_238;
  puVar11 = VP8Scan;
  do {
    (*VP8FTransform2)(puVar2 + *puVar11,puVar3 + (ulong)*puVar11 + (ulong)uVar1,piVar6);
    uVar9 = uVar9 + 2;
    piVar6 = piVar6 + 0x20;
    puVar11 = puVar11 + 2;
  } while (uVar9 < 0xe);
  (*VP8FTransformWHT)(local_238,local_258);
  iVar5 = (*VP8EncQuantizeBlockWHT)(local_258,rd->y_dc_levels,&enc->dqm_[uVar4].y2_);
  uVar8 = iVar5 << 0x18;
  if (it->do_trellis_ == 0) {
    paiVar12 = rd->y_ac_levels;
    uVar9 = 0xfffffffffffffffe;
    piVar6 = local_238;
    do {
      piVar6[0x10] = 0;
      *piVar6 = 0;
      iVar5 = (*VP8EncQuantize2Blocks)(piVar6,*paiVar12,&enc->dqm_[uVar4].y1_);
      uVar9 = uVar9 + 2;
      uVar8 = uVar8 | iVar5 << ((byte)uVar9 & 0x1f);
      piVar6 = piVar6 + 0x20;
      paiVar12 = paiVar12 + 2;
    } while (uVar9 < 0xe);
  }
  else {
    VP8IteratorNzToBytes(it);
    lVar15 = 0;
    lVar14 = 0;
    do {
      lVar13 = (long)(int)lVar14;
      lVar7 = 0;
      piVar10 = it->top_nz_;
      lVar14 = lVar13;
      do {
        iVar5 = TrellisQuantizeBlock
                          (enc,(int16_t *)((long)local_238 + lVar7 + lVar13 * 0x20),
                           (int16_t *)((long)rd->y_ac_levels[lVar13] + lVar7),
                           it->left_nz_[lVar15] + *piVar10,0,&enc->dqm_[uVar4].y1_,
                           enc->dqm_[uVar4].lambda_trellis_i16_);
        it->left_nz_[lVar15] = iVar5;
        *piVar10 = iVar5;
        *(undefined2 *)((long)rd->y_ac_levels[lVar13] + lVar7) = 0;
        uVar8 = uVar8 | iVar5 << ((byte)lVar14 & 0x1f);
        lVar14 = lVar14 + 1;
        piVar10 = piVar10 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x80);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
  }
  piVar6 = local_238;
  (*VP8TransformWHT)(local_258,piVar6);
  uVar9 = 0xfffffffffffffffe;
  puVar11 = VP8Scan;
  do {
    (*VP8ITransform)(puVar3 + (ulong)*puVar11 + (ulong)uVar1,piVar6,yuv_out + *puVar11,1);
    uVar9 = uVar9 + 2;
    piVar6 = piVar6 + 0x20;
    puVar11 = puVar11 + 2;
  } while (uVar9 < 0xe);
  return uVar8;
}

Assistant:

static int ReconstructIntra16(VP8EncIterator* WEBP_RESTRICT const it,
                              VP8ModeScore* WEBP_RESTRICT const rd,
                              uint8_t* WEBP_RESTRICT const yuv_out,
                              int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I16ModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + Y_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[16][16], dc_tmp[16];

  for (n = 0; n < 16; n += 2) {
    VP8FTransform2(src + VP8Scan[n], ref + VP8Scan[n], tmp[n]);
  }
  VP8FTransformWHT(tmp[0], dc_tmp);
  nz |= VP8EncQuantizeBlockWHT(dc_tmp, rd->y_dc_levels, &dqm->y2_) << 24;

  if (DO_TRELLIS_I16 && it->do_trellis_) {
    int x, y;
    VP8IteratorNzToBytes(it);
    for (y = 0, n = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x, ++n) {
        const int ctx = it->top_nz_[x] + it->left_nz_[y];
        const int non_zero = TrellisQuantizeBlock(
            enc, tmp[n], rd->y_ac_levels[n], ctx, TYPE_I16_AC, &dqm->y1_,
            dqm->lambda_trellis_i16_);
        it->top_nz_[x] = it->left_nz_[y] = non_zero;
        rd->y_ac_levels[n][0] = 0;
        nz |= non_zero << n;
      }
    }
  } else {
    for (n = 0; n < 16; n += 2) {
      // Zero-out the first coeff, so that: a) nz is correct below, and
      // b) finding 'last' non-zero coeffs in SetResidualCoeffs() is simplified.
      tmp[n][0] = tmp[n + 1][0] = 0;
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->y_ac_levels[n], &dqm->y1_) << n;
      assert(rd->y_ac_levels[n + 0][0] == 0);
      assert(rd->y_ac_levels[n + 1][0] == 0);
    }
  }

  // Transform back
  VP8TransformWHT(dc_tmp, tmp[0]);
  for (n = 0; n < 16; n += 2) {
    VP8ITransform(ref + VP8Scan[n], tmp[n], yuv_out + VP8Scan[n], 1);
  }

  return nz;
}